

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

int Ssw_SmlNodesCompareInFrame
              (Ssw_Sml_t *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1,int iFrame0,int iFrame1)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  int local_44;
  int i;
  uint *pSims1;
  uint *pSims0;
  int iFrame1_local;
  int iFrame0_local;
  Aig_Obj_t *pObj1_local;
  Aig_Obj_t *pObj0_local;
  Ssw_Sml_t *p_local;
  
  if (p->nFrames <= iFrame0) {
    __assert_fail("iFrame0 < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x308,
                  "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  if (p->nFrames <= iFrame1) {
    __assert_fail("iFrame1 < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x309,
                  "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  iVar1 = Aig_IsComplement(pObj0);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                  ,0x30a,
                  "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  iVar1 = Aig_IsComplement(pObj1);
  if (iVar1 == 0) {
    if ((iFrame0 != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
      __assert_fail("iFrame0 == 0 || p->nWordsFrame < p->nWordsTotal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                    ,0x30c,
                    "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                   );
    }
    if ((iFrame1 != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
      __assert_fail("iFrame1 == 0 || p->nWordsFrame < p->nWordsTotal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                    ,0x30d,
                    "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                   );
    }
    puVar2 = Ssw_ObjSim(p,pObj0->Id);
    iVar1 = p->nWordsFrame;
    puVar3 = Ssw_ObjSim(p,pObj1->Id);
    local_44 = 0;
    while( true ) {
      if (p->nWordsFrame <= local_44) {
        return 1;
      }
      if (puVar2[(long)(iVar1 * iFrame0) + (long)local_44] !=
          puVar3[(long)(p->nWordsFrame * iFrame1) + (long)local_44]) break;
      local_44 = local_44 + 1;
    }
    return 0;
  }
  __assert_fail("!Aig_IsComplement(pObj1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswSim.c"
                ,0x30b,
                "int Ssw_SmlNodesCompareInFrame(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
}

Assistant:

int Ssw_SmlNodesCompareInFrame( Ssw_Sml_t * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1, int iFrame0, int iFrame1 )
{
    unsigned * pSims0, * pSims1;
    int i;
    assert( iFrame0 < p->nFrames );
    assert( iFrame1 < p->nFrames );
    assert( !Aig_IsComplement(pObj0) );
    assert( !Aig_IsComplement(pObj1) );
    assert( iFrame0 == 0 || p->nWordsFrame < p->nWordsTotal );
    assert( iFrame1 == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims0  = Ssw_ObjSim(p, pObj0->Id) + p->nWordsFrame * iFrame0;
    pSims1  = Ssw_ObjSim(p, pObj1->Id) + p->nWordsFrame * iFrame1;
    // compare
    for ( i = 0; i < p->nWordsFrame; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}